

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkDeclarationInArith(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  TreeOp TVar2;
  Node *pNVar3;
  Node *this_00;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *rhs;
  Expr *lhs;
  CheckerVisitor *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    TVar2 = Node::op((Node *)in_RSI);
    bVar1 = isArithOperator(TVar2);
    if (bVar1) {
      BinExpr::lhs(in_RSI);
      pNVar3 = &maybeEval(in_stack_ffffffffffffffe0,(Expr *)in_RDI,false)->super_Node;
      BinExpr::rhs(in_RSI);
      this_00 = &maybeEval(in_stack_ffffffffffffffe0,(Expr *)in_RDI,false)->super_Node;
      TVar2 = Node::op(pNVar3);
      if ((TVar2 == TO_DECL_EXPR) || (TVar2 = Node::op(pNVar3), TVar2 == TO_ARRAYEXPR)) {
        pNVar3 = &BinExpr::lhs(in_RSI)->super_Node;
        report(in_RDI,pNVar3,0x7b);
      }
      TVar2 = Node::op((Node *)in_RSI);
      if (((TVar2 != TO_OROR) && (TVar2 = Node::op((Node *)in_RSI), TVar2 != TO_ANDAND)) &&
         ((TVar2 = Node::op(this_00), TVar2 == TO_DECL_EXPR ||
          (TVar2 = Node::op(this_00), TVar2 == TO_ARRAYEXPR)))) {
        pNVar3 = &BinExpr::rhs(in_RSI)->super_Node;
        report(in_RDI,pNVar3,0x7b);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkDeclarationInArith(const BinExpr *bin) {

  if (effectsOnly)
    return;

  if (isArithOperator(bin->op())) {
    const Expr *lhs = maybeEval(bin->lhs());
    const Expr *rhs = maybeEval(bin->rhs());

    if (lhs->op() == TO_DECL_EXPR || lhs->op() == TO_ARRAYEXPR) {
      report(bin->lhs(), DiagnosticsId::DI_DECL_IN_EXPR);
    }

    if (bin->op() != TO_OROR && bin->op() != TO_ANDAND) {
      if (rhs->op() == TO_DECL_EXPR || rhs->op() == TO_ARRAYEXPR) {
        report(bin->rhs(), DiagnosticsId::DI_DECL_IN_EXPR);
      }
    }
  }
}